

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcemodel.cpp
# Opt level: O2

int __thiscall FSSResourceModel::rowCount(FSSResourceModel *this,QModelIndex *parent)

{
  bool bVar1;
  uint uVar2;
  QModelIndex p;
  
  bVar1 = QModelIndex::isValid(parent);
  if (bVar1) {
    QModelIndex::parent(&p,parent);
    if (((p.r < 0) || (p.c < 0)) || (uVar2 = 0, p.m == (QAbstractItemModel *)0x0)) {
      uVar2 = Data::get_resource_count(parent->r + AssetArtLandscape);
    }
  }
  else {
    uVar2 = 0x21;
  }
  return uVar2;
}

Assistant:

int
FSSResourceModel::rowCount(const QModelIndex &parent) const {
  if (!parent.isValid()) {
    return static_cast<int>(Data::AssetCursor);
  }

  QModelIndex p = parent.parent();
  if (!p.isValid()) {
    return Data::get_resource_count((Data::Resource)(parent.row() + 1));
  }

  return 0;
}